

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::DrawReadBuffersErrorsTest::PrepareObjects
          (DrawReadBuffersErrorsTest *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  deUint32 dVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  GLenum *pGVar9;
  GLint max_draw_buffers;
  long lVar8;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar8 + 0x6d0))(1,&this->m_fbo_valid);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1613);
  (**(code **)(lVar8 + 0x78))(0x8d40,this->m_fbo_valid);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1616);
  do {
    pcVar2 = *(code **)(lVar8 + 0xc88);
    this->m_fbo_invalid = this->m_fbo_invalid + 1;
    cVar4 = (*pcVar2)();
  } while (cVar4 != '\0');
  (**(code **)(lVar8 + 0x868))(0x8cdf,&this->m_max_color_attachments);
  GVar7 = this->m_attachment_invalid;
  do {
    if ((GVar7 - 0x3ff < 9) || (GVar7 == 0xffffffff)) {
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    uVar1 = GVar7 - 0x8cdf;
    GVar7 = GVar7 + 1;
  } while (uVar1 <= this->m_max_color_attachments - 1U && 0 < this->m_max_color_attachments || bVar3
          );
  this->m_attachment_invalid = GVar7;
  this->m_attachments_invalid[0] = 0x8ce0;
  this->m_attachments_invalid[1] = 0x8ce0;
  (**(code **)(lVar8 + 0x868))(0x8824);
  this->m_attachments_too_many_count = 9;
  pGVar9 = (GLenum *)operator_new__(0x24);
  this->m_attachments_too_many = pGVar9;
  *pGVar9 = 0x8ce0;
  memset(pGVar9 + 1,0,0x20);
  return;
}

Assistant:

void DrawReadBuffersErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid objects. */
	gl.genFramebuffers(1, &m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Invalid objects. */
	while (gl.isFramebuffer(++m_fbo_invalid))
		;

	/* Invalid attachment. */
	gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &m_max_color_attachments);

	bool is_attachment = true;

	while (is_attachment)
	{
		++m_attachment_invalid;

		is_attachment = false;

		/* Valid attachments are those from tables 17.4, 17.5 and a 17.6 (valid for various functions and framebuffer types).
		 (see OpenGL 4.5 Core Profile Specification) */
		switch (m_attachment_invalid)
		{
		case GL_NONE:
		case GL_FRONT_LEFT:
		case GL_FRONT_RIGHT:
		case GL_BACK_LEFT:
		case GL_BACK_RIGHT:
		case GL_FRONT:
		case GL_BACK:
		case GL_LEFT:
		case GL_RIGHT:
		case GL_FRONT_AND_BACK:
			is_attachment = true;
		};

		for (glw::GLint i = 0; i < m_max_color_attachments; ++i)
		{
			if ((glw::GLenum)(GL_COLOR_ATTACHMENT0 + i) == m_attachment_invalid)
			{
				is_attachment = true;
				break;
			}
		}
	}

	m_attachments_invalid[0] = GL_COLOR_ATTACHMENT0;
	m_attachments_invalid[1] = GL_COLOR_ATTACHMENT0;

	glw::GLint max_draw_buffers = 8; /* Spec default. */
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &max_draw_buffers);

	m_attachments_too_many_count = max_draw_buffers + 1;

	m_attachments_too_many = new glw::GLenum[m_attachments_too_many_count];

	m_attachments_too_many[0] = GL_COLOR_ATTACHMENT0;

	for (glw::GLint i = 1; i < m_attachments_too_many_count; ++i)
	{
		m_attachments_too_many[i] = GL_NONE;
	}
}